

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

double __thiscall
HighsMipSolverData::limitsToGap
          (HighsMipSolverData *this,double use_lower_bound,double use_upper_bound,double *lb,
          double *ub)

{
  double dVar1;
  double dVar2;
  
  dVar2 = this->mipsolver->model_->offset_;
  dVar1 = use_lower_bound + dVar2;
  *lb = dVar1;
  if (ABS(dVar1) <= this->epsilon) {
    *lb = 0.0;
  }
  *ub = INFINITY;
  dVar1 = INFINITY;
  if (use_upper_bound < INFINITY) {
    dVar2 = dVar2 + use_upper_bound;
    *ub = dVar2;
    if (ABS(dVar2) <= this->epsilon) {
      *ub = 0.0;
    }
    dVar2 = *lb;
    if (*ub <= *lb) {
      dVar2 = *ub;
    }
    *lb = dVar2;
    dVar1 = *ub;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return (double)(~-(ulong)(dVar2 == 0.0) & 0x7ff0000000000000);
    }
    dVar1 = (dVar1 - dVar2) / ABS(dVar1);
  }
  return dVar1;
}

Assistant:

double HighsMipSolverData::limitsToGap(const double use_lower_bound,
                                       const double use_upper_bound, double& lb,
                                       double& ub) const {
  double offset = mipsolver.model_->offset_;
  lb = use_lower_bound + offset;
  if (std::abs(lb) <= epsilon) lb = 0;
  ub = kHighsInf;
  double gap = kHighsInf;
  if (use_upper_bound != kHighsInf) {
    ub = use_upper_bound + offset;
    if (std::fabs(ub) <= epsilon) ub = 0;
    lb = std::min(ub, lb);
    if (ub == 0.0)
      gap = lb == 0.0 ? 0.0 : kHighsInf;
    else
      gap = (ub - lb) / fabs(ub);
  }
  return gap;
}